

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-create.cc
# Opt level: O1

int main(int argc,char **argv)

{
  char *pcVar1;
  pointer pcVar2;
  string *psVar3;
  pointer pbVar4;
  byte bVar5;
  char cVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  ostream *poVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  ImageProvider *this;
  ulong uVar13;
  ulong uVar14;
  logic_error *plVar15;
  undefined *puVar16;
  ulong uVar17;
  ulong uVar18;
  int iVar19;
  long lVar20;
  ulong uVar21;
  string *filter_00;
  string *color_space_00;
  long lVar22;
  ulong uVar23;
  QPDFObjectHandle QVar24;
  Pl_Buffer b_p;
  QPDF pdf;
  string desired_color_space;
  QPDF pdf_1;
  string desired_filter;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  filters;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  color_spaces;
  shared_ptr<Buffer> actual_data;
  QPDFObjectHandle image;
  QPDFObjectHandle font;
  shared_ptr<QPDFObjectHandle::StreamDataProvider> provider;
  QPDFObjectHandle filter;
  QPDFObjectHandle color_space;
  QPDFObjectHandle image_dict;
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> pages;
  QPDFPageDocumentHelper dh;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
  images;
  long local_238;
  string local_230;
  QPDF local_1f8 [8];
  ulong local_1f0;
  string local_1e8;
  QPDF local_1c8 [8];
  long *local_1c0;
  char *local_1b8;
  long local_1b0 [2];
  char *local_1a0;
  Buffer *local_198;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_190;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_188;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_168;
  undefined1 local_150 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_148;
  undefined *local_140;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_138;
  QPDFObjectHandle local_130;
  element_type *local_120;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_118;
  ImageProvider *local_110;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_108;
  string local_100 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_f8;
  string local_f0 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_e8;
  ulong local_e0;
  ulong local_d8;
  char *local_d0;
  QPDFWriter local_c8 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c0;
  char local_b8 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_b0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a0;
  char *local_98;
  char *local_90;
  QPDFPageDocumentHelper local_80;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
  local_60 [24];
  long local_48;
  long local_38;
  
  whoami = (char *)QUtil::getWhoami(*argv);
  if (argc == 2) {
    pcVar1 = argv[1];
    QPDF::QPDF(local_1f8);
    QPDF::emptyPDF();
    operator____qpdf(local_b8,0x10a1ac);
    QVar24.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f8;
    QVar24.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)&local_120;
    QPDF::makeIndirectObject(QVar24);
    if (local_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b0);
    }
    local_168.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
    local_168.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
    local_168.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[12]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_168,
               (char (*) [12])"/DeviceCMYK");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[11]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_168,
               (char (*) [11])"/DeviceRGB");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[12]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_168,
               (char (*) [12])"/DeviceGray");
    local_188.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
    local_188.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
    local_188.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[5]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_188,
               (char (*) [5])"null");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[11]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_188,
               (char (*) [11])"/DCTDecode");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[17]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_188,
               (char (*) [17])"/RunLengthDecode");
    local_1a0 = pcVar1;
    QPDFPageDocumentHelper::QPDFPageDocumentHelper(&local_80,local_1f8);
    pbVar4 = local_168.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (local_168.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_168.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      filter_00 = local_188.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      psVar3 = local_188.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      color_space_00 =
           local_168.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      do {
        for (; filter_00 != psVar3; filter_00 = filter_00 + 1) {
          local_130.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = local_120;
          local_130.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = local_118;
          if (local_118 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              local_118->_M_use_count = local_118->_M_use_count + 1;
              UNLOCK();
            }
            else {
              local_118->_M_use_count = local_118->_M_use_count + 1;
            }
          }
          add_page(&local_80,&local_130,color_space_00,filter_00);
          if (local_130.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_130.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
            ;
          }
        }
        color_space_00 = color_space_00 + 1;
        filter_00 = local_188.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        psVar3 = local_188.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      } while (color_space_00 != pbVar4);
    }
    pcVar1 = local_1a0;
    QPDFWriter::QPDFWriter(local_c8,local_1f8,local_1a0);
    QPDFWriter::write();
    lVar20 = (long)local_168.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_168.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    lVar22 = (long)local_188.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_188.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    QPDF::QPDF(local_1c8);
    QPDF::processFile((char *)local_1c8,pcVar1);
    QPDFPageDocumentHelper::QPDFPageDocumentHelper((QPDFPageDocumentHelper *)&local_230,local_1c8);
    QPDFPageDocumentHelper::getAllPages();
    uVar21 = lVar20 >> 5;
    uVar23 = lVar22 >> 5;
    QPDFPageDocumentHelper::~QPDFPageDocumentHelper((QPDFPageDocumentHelper *)&local_230);
    if (uVar23 * uVar21 + ((long)local_90 - (long)local_98 >> 3) * -0x6db6db6db6db6db7 == 0) {
      if (local_98 != local_90) {
        local_d0 = local_90;
        local_238 = 1;
        local_1f0 = 0;
        local_e0 = uVar21;
        local_d8 = uVar23;
        do {
          local_1a0 = local_98;
          QPDFPageObjectHelper::getImages_abi_cxx11_();
          if (local_38 != 1) {
            plVar15 = (logic_error *)__cxa_allocate_exception(0x10);
            std::logic_error::logic_error(plVar15,"incorrect number of images on page");
            __cxa_throw(plVar15,&std::logic_error::typeinfo,std::logic_error::~logic_error);
          }
          uVar10 = (local_238 - 1U) / uVar21;
          pcVar2 = local_168.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar10]._M_dataplus._M_p;
          local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1e8,pcVar2,
                     pcVar2 + local_168.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar10]._M_string_length);
          uVar10 = (local_238 - 1U) % uVar23;
          local_1c0 = local_1b0;
          pcVar2 = local_188.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar10]._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1c0,pcVar2,
                     pcVar2 + local_188.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar10]._M_string_length);
          iVar7 = std::__cxx11::string::compare((char *)&local_1c0);
          if (iVar7 == 0) {
            std::__cxx11::string::_M_replace((ulong)&local_1c0,0,local_1b8,0x10a263);
          }
          local_140 = *(undefined **)(local_48 + 0x40);
          local_138 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_48 + 0x48);
          puVar16 = local_140;
          if (local_138 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            puVar16 = &__libc_single_threaded;
            if (__libc_single_threaded == '\0') {
              LOCK();
              local_138->_M_use_count = local_138->_M_use_count + 1;
              UNLOCK();
            }
            else {
              local_138->_M_use_count = local_138->_M_use_count + 1;
            }
          }
          QPDFObjectHandle::getDict();
          local_230.field_2._M_allocated_capacity._0_4_ = 0x6c6f432f;
          local_230.field_2._M_local_buf[4] = 'o';
          local_230.field_2._M_allocated_capacity._5_2_ = 0x5372;
          local_230.field_2._7_4_ = 0x65636170;
          local_230._M_string_length = 0xb;
          local_230.field_2._M_local_buf[0xb] = '\0';
          local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
          QPDFObjectHandle::getKey(local_f0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_230._M_dataplus._M_p != &local_230.field_2) {
            operator_delete(local_230._M_dataplus._M_p,
                            CONCAT17(local_230.field_2._M_local_buf[7],
                                     CONCAT25(local_230.field_2._M_allocated_capacity._5_2_,
                                              CONCAT14(local_230.field_2._M_local_buf[4],
                                                       local_230.field_2._M_allocated_capacity._0_4_
                                                      ))) + 1);
          }
          local_230.field_2._M_local_buf[4] = 't';
          local_230.field_2._M_allocated_capacity._5_2_ = 0x7265;
          local_230.field_2._M_allocated_capacity._0_4_ = 0x6c69462f;
          local_230._M_string_length = 7;
          local_230.field_2._7_4_ = local_230.field_2._7_4_ & 0xffffff00;
          local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
          QPDFObjectHandle::getKey(local_100);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_230._M_dataplus._M_p != &local_230.field_2) {
            operator_delete(local_230._M_dataplus._M_p,
                            CONCAT17(local_230.field_2._M_local_buf[7],
                                     CONCAT25(local_230.field_2._M_allocated_capacity._5_2_,
                                              CONCAT14(local_230.field_2._M_local_buf[4],
                                                       local_230.field_2._M_allocated_capacity._0_4_
                                                      ))) + 1);
          }
          bVar5 = QPDFObjectHandle::isNameAndEquals(local_100);
          if (bVar5 == 0) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"page ",5);
            poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,": expected filter ",0x12);
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar11,(char *)local_1c0,(long)local_1b8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,"; actual filter = ",0x12);
            QPDFObjectHandle::unparse_abi_cxx11_();
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar11,local_230._M_dataplus._M_p,local_230._M_string_length);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
            std::ostream::put((char)poVar11);
            std::ostream::flush();
            paVar12 = &local_230.field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_230._M_dataplus._M_p != paVar12) {
              operator_delete(local_230._M_dataplus._M_p,
                              CONCAT17(local_230.field_2._M_local_buf[7],
                                       CONCAT25(local_230.field_2._M_allocated_capacity._5_2_,
                                                CONCAT14(local_230.field_2._M_local_buf[4],
                                                         local_230.field_2._M_allocated_capacity.
                                                         _0_4_))) + 1);
              paVar12 = extraout_RAX;
            }
            local_1f0 = CONCAT71((int7)((ulong)paVar12 >> 8),1);
          }
          cVar6 = QPDFObjectHandle::isNameAndEquals(local_f0);
          if (cVar6 == '\0') {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"page ",5);
            poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar11,": expected color space ",0x17);
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar11,local_1e8._M_dataplus._M_p,local_1e8._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar11,"; actual color space = ",0x17);
            QPDFObjectHandle::unparse_abi_cxx11_();
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar11,local_230._M_dataplus._M_p,local_230._M_string_length);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
            std::ostream::put((char)poVar11);
            std::ostream::flush();
            paVar12 = &local_230.field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_230._M_dataplus._M_p != paVar12) {
              operator_delete(local_230._M_dataplus._M_p,
                              CONCAT17(local_230.field_2._M_local_buf[7],
                                       CONCAT25(local_230.field_2._M_allocated_capacity._5_2_,
                                                CONCAT14(local_230.field_2._M_local_buf[4],
                                                         local_230.field_2._M_allocated_capacity.
                                                         _0_4_))) + 1);
              paVar12 = extraout_RAX_00;
            }
            bVar5 = 1;
            local_1f0 = CONCAT71((int7)((ulong)paVar12 >> 8),1);
          }
          else {
            bVar5 = bVar5 ^ 1;
          }
          if (bVar5 == 0) {
            QPDFObjectHandle::getStreamData((qpdf_stream_decode_level_e)local_150);
            this = (ImageProvider *)operator_new(0x88);
            local_230.field_2._M_allocated_capacity._0_4_ = 0x6c6c756e;
            local_230._M_string_length = 4;
            local_230.field_2._M_local_buf[4] = '\0';
            local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
            ImageProvider::ImageProvider(this,&local_1e8,&local_230);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_230._M_dataplus._M_p != &local_230.field_2) {
              operator_delete(local_230._M_dataplus._M_p,
                              CONCAT17(local_230.field_2._M_local_buf[7],
                                       CONCAT25(local_230.field_2._M_allocated_capacity._5_2_,
                                                CONCAT14(local_230.field_2._M_local_buf[4],
                                                         local_230.field_2._M_allocated_capacity.
                                                         _0_4_))) + 1);
            }
            local_110 = this;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<ImageProvider*>
                      (&local_108,this);
            Pl_Buffer::Pl_Buffer((Pl_Buffer *)&local_230,"get image data",(Pipeline *)0x0);
            local_198 = (Buffer *)0x0;
            (**(code **)(*(long *)local_110 + 0x10))(local_110,&local_198,&local_230);
            local_198 = (Buffer *)Pl_Buffer::getBuffer();
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Buffer*>
                      (&local_190,local_198);
            lVar20 = Buffer::getSize();
            lVar22 = Buffer::getSize();
            if (lVar20 == lVar22) {
              lVar20 = Buffer::getBuffer();
              lVar22 = Buffer::getBuffer();
              uVar10 = Buffer::getSize();
              iVar8 = std::__cxx11::string::compare((char *)&local_1c0);
              iVar7 = 0;
              if (iVar8 == 0) {
                iVar7 = -10;
              }
              iVar19 = 0;
              if (iVar8 == 0) {
                iVar19 = 10;
              }
              uVar9 = std::__cxx11::string::compare((char *)&local_1c0);
              uVar23 = local_d8;
              uVar21 = local_e0;
              uVar18 = uVar10 / 0x28;
              if (uVar9 != 0) {
                uVar18 = 0;
              }
              uVar13 = 0;
              uVar17 = (ulong)uVar9;
              if (uVar10 != 0) {
                uVar14 = 0;
                uVar13 = 0;
                do {
                  iVar8 = (uint)*(byte *)(lVar20 + uVar14) - (uint)*(byte *)(lVar22 + uVar14);
                  uVar13 = (ulong)((int)uVar13 + (uint)(iVar8 < iVar7 || iVar19 < iVar8));
                  uVar14 = uVar14 + 1;
                  uVar17 = uVar13;
                } while (uVar10 != uVar14);
              }
              if (uVar18 < uVar13) {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"page ",5);
                poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
                std::__ostream_insert<char,std::char_traits<char>>(poVar11,": ",2);
                poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar11,local_1e8._M_dataplus._M_p,local_1e8._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar11,", ",2);
                poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar11,(char *)local_1c0,(long)local_1b8);
                std::__ostream_insert<char,std::char_traits<char>>(poVar11,": mismatches: ",0xe);
                poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
                std::__ostream_insert<char,std::char_traits<char>>(poVar11," of ",4);
                poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
                std::ostream::put((char)poVar11);
                local_1f0 = CONCAT71((int7)(uVar17 >> 8),1);
                std::ostream::flush();
              }
            }
            else {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"page ",5);
              poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar11,": image data length mismatch",0x1c);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
              std::ostream::put((char)poVar11);
              local_1f0 = CONCAT71((int7)((ulong)puVar16 >> 8),1);
              std::ostream::flush();
            }
            if (local_190._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_190._M_pi);
            }
            Pl_Buffer::~Pl_Buffer((Pl_Buffer *)&local_230);
            if (local_108._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_108._M_pi);
            }
            if (local_148 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_148);
            }
          }
          if (local_f8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f8);
          }
          if (local_e8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e8);
          }
          if (local_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a0);
          }
          if (local_138 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_138);
          }
          if (local_1c0 != local_1b0) {
            operator_delete(local_1c0,local_1b0[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
            operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
          }
          local_238 = local_238 + 1;
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
          ::~_Rb_tree(local_60);
          local_98 = local_1a0 + 0x38;
        } while (local_98 != local_d0);
        if ((local_1f0 & 1) != 0) {
          plVar15 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(plVar15,"errors found");
          __cxa_throw(plVar15,&std::logic_error::typeinfo,std::logic_error::~logic_error);
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"all checks passed",0x11);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
      std::ostream::put(-0x28);
      std::ostream::flush();
      std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector
                ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)&local_98);
      QPDF::~QPDF(local_1c8);
      if (local_c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c0);
      }
      QPDFPageDocumentHelper::~QPDFPageDocumentHelper(&local_80);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_188);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_168);
      if (local_118 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_118);
      }
      QPDF::~QPDF(local_1f8);
      return 0;
    }
  }
  else {
    usage();
  }
  plVar15 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(plVar15,"incorrect number of pages");
  __cxa_throw(plVar15,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

int
main(int argc, char* argv[])
{
    whoami = QUtil::getWhoami(argv[0]);

    if (argc != 2) {
        usage();
    }
    char const* filename = argv[1];

    try {
        create_pdf(filename);
    } catch (std::exception& e) {
        std::cerr << e.what() << std::endl;
        exit(2);
    }

    return 0;
}